

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.h
# Opt level: O3

void __thiscall uWS::TemplatedApp<false>::~TemplatedApp(TemplatedApp<false> *this)

{
  pointer ppWVar1;
  void *in_RSI;
  pointer ppWVar2;
  
  if (this->httpContext != (HttpContext<false> *)0x0) {
    HttpContext<false>::free(this->httpContext,in_RSI);
    ppWVar1 = (this->webSocketContexts).
              super__Vector_base<uWS::WebSocketContext<false,_true>_*,_std::allocator<uWS::WebSocketContext<false,_true>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppWVar2 = (this->webSocketContexts).
                   super__Vector_base<uWS::WebSocketContext<false,_true>_*,_std::allocator<uWS::WebSocketContext<false,_true>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppWVar2 != ppWVar1;
        ppWVar2 = ppWVar2 + 1) {
      WebSocketContext<false,_true>::free(*ppWVar2,in_RSI);
    }
  }
  ppWVar2 = (this->webSocketContexts).
            super__Vector_base<uWS::WebSocketContext<false,_true>_*,_std::allocator<uWS::WebSocketContext<false,_true>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppWVar2 != (pointer)0x0) {
    operator_delete(ppWVar2,(long)(this->webSocketContexts).
                                  super__Vector_base<uWS::WebSocketContext<false,_true>_*,_std::allocator<uWS::WebSocketContext<false,_true>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppWVar2
                   );
    return;
  }
  return;
}

Assistant:

~TemplatedApp() {
        /* Let's just put everything here */
        if (httpContext) {
            httpContext->free();

            for (auto *webSocketContext : webSocketContexts) {
                webSocketContext->free();
            }
        }
    }